

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O2

int __thiscall btMultiBodyJointLimitConstraint::getIslandIdA(btMultiBodyJointLimitConstraint *this)

{
  uint uVar1;
  btMultiBody *pbVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  btMultiBodyLinkCollider *pbVar6;
  
  pbVar2 = (this->super_btMultiBodyConstraint).m_bodyA;
  iVar3 = -1;
  if (pbVar2 != (btMultiBody *)0x0) {
    pbVar6 = pbVar2->m_baseCollider;
    if (pbVar6 == (btMultiBodyLinkCollider *)0x0) {
      uVar1 = (pbVar2->m_links).m_size;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = 0;
      }
      uVar4 = 0;
      do {
        if (uVar5 * 600 + 600 == uVar4 + 600) {
          return -1;
        }
        pbVar6 = *(btMultiBodyLinkCollider **)
                  ((long)((pbVar2->m_links).m_data)->m_jointTorque + uVar4 + 0x1c);
        uVar4 = uVar4 + 600;
      } while (pbVar6 == (btMultiBodyLinkCollider *)0x0);
    }
    iVar3 = *(int *)(pbVar6 + 0xe4);
  }
  return iVar3;
}

Assistant:

int btMultiBodyJointLimitConstraint::getIslandIdA() const
{
	if(m_bodyA)
	{
		btMultiBodyLinkCollider* col = m_bodyA->getBaseCollider();
		if (col)
			return col->getIslandTag();
		for (int i=0;i<m_bodyA->getNumLinks();i++)
		{
			if (m_bodyA->getLink(i).m_collider)
				return m_bodyA->getLink(i).m_collider->getIslandTag();
		}
	}
	return -1;
}